

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O1

bool __thiscall CfgNode::addPredecessor(CfgNode *this,CfgNode *pred)

{
  pair<std::_Rb_tree_iterator<CfgNode::Edge>,_bool> pVar1;
  Edge local_10;
  
  if (this->m_type == CFG_ENTRY) {
    __assert_fail("this->type() != CfgNode::CFG_ENTRY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CfgNode.cpp"
                  ,0x5b,"bool CfgNode::addPredecessor(CfgNode *)");
  }
  if (1 < pred->m_type - CFG_EXIT) {
    if (pred->m_type != CFG_PHANTOM) {
      local_10._vptr_Edge = (_func_int **)&PTR__Edge_001179f8;
      local_10.node = pred;
      pVar1 = std::
              _Rb_tree<CfgNode::Edge,_CfgNode::Edge,_std::_Identity<CfgNode::Edge>,_std::less<CfgNode::Edge>,_std::allocator<CfgNode::Edge>_>
              ::_M_insert_unique<CfgNode::Edge>(&(this->m_preds)._M_t,&local_10);
      return (bool)(pVar1.second & 1);
    }
    __assert_fail("pred->type() != CfgNode::CFG_PHANTOM",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CfgNode.cpp"
                  ,0x5c,"bool CfgNode::addPredecessor(CfgNode *)");
  }
  __assert_fail("pred->type() != CfgNode::CFG_EXIT && pred->type() != CfgNode::CFG_HALT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CfgNode.cpp"
                ,0x5d,"bool CfgNode::addPredecessor(CfgNode *)");
}

Assistant:

bool CfgNode::addPredecessor(CfgNode* pred) {
	assert(this->type() != CfgNode::CFG_ENTRY);
	assert(pred->type() != CfgNode::CFG_PHANTOM);
	assert(pred->type() != CfgNode::CFG_EXIT && pred->type() != CfgNode::CFG_HALT);

	return m_preds.insert(CfgNode::Edge(pred)).second;
}